

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O1

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  int iVar1;
  undefined1 auVar2 [16];
  stbrp_node **ppsVar3;
  stbrp_context *psVar4;
  uint uVar5;
  size_t __nmemb;
  size_t extraout_RAX;
  ulong uVar6;
  size_t extraout_RAX_00;
  int *piVar7;
  long lVar8;
  size_t sVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  stbrp_node **ppsVar13;
  stbrp_node *psVar14;
  stbrp_node *psVar15;
  stbrp_node **in_R8;
  stbrp_node *psVar16;
  stbrp_rect *psVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  stbrp_context *psVar21;
  ulong uVar22;
  stbrp_context *c;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int waste;
  int local_a8;
  uint local_a4;
  stbrp_node **local_a0;
  int local_90;
  int local_8c;
  stbrp_context *local_88;
  ulong local_80;
  size_t local_78;
  stbrp_node **local_70;
  stbrp_node *local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  stbrp_rect *local_40;
  stbrp_rect *local_38;
  
  auVar2 = _DAT_0024e060;
  uVar20 = (ulong)(uint)num_rects;
  uVar22 = (ulong)(uint)num_rects;
  if (0 < num_rects) {
    lVar8 = uVar22 - 1;
    auVar24._8_4_ = (int)lVar8;
    auVar24._0_8_ = lVar8;
    auVar24._12_4_ = (int)((ulong)lVar8 >> 0x20);
    piVar7 = &rects->was_packed;
    uVar11 = 0;
    auVar24 = auVar24 ^ _DAT_0024e060;
    auVar25 = _DAT_002562f0;
    do {
      auVar26 = auVar25 ^ auVar2;
      if ((bool)(~(auVar26._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar26._0_4_ ||
                  auVar24._4_4_ < auVar26._4_4_) & 1)) {
        *piVar7 = (int)uVar11;
      }
      if ((auVar26._12_4_ != auVar24._12_4_ || auVar26._8_4_ <= auVar24._8_4_) &&
          auVar26._12_4_ <= auVar24._12_4_) {
        piVar7[6] = (int)uVar11 + 1;
      }
      uVar11 = uVar11 + 2;
      lVar8 = auVar25._8_8_;
      auVar25._0_8_ = auVar25._0_8_ + 2;
      auVar25._8_8_ = lVar8 + 2;
      piVar7 = piVar7 + 0xc;
    } while ((num_rects + 1U & 0xfffffffe) != uVar11);
  }
  __nmemb = (size_t)num_rects;
  local_78 = __nmemb;
  if (1 < (uint)num_rects) {
    qsort(rects,__nmemb,0x18,rect_height_compare);
    __nmemb = extraout_RAX;
  }
  if (0 < num_rects) {
    local_70 = &context->active_head;
    uVar11 = 0;
    local_88 = context;
    local_50 = uVar20;
    local_48 = uVar22;
    local_40 = rects;
    do {
      psVar17 = rects + uVar11;
      uVar12 = psVar17->w;
      uVar6 = (ulong)uVar12;
      if (uVar12 == 0) {
LAB_0020e5dd:
        psVar17->y = 0;
        __nmemb = 0;
        lVar8 = 0xc;
        local_a0 = in_R8;
      }
      else {
        uVar19 = psVar17->h;
        local_80 = (ulong)uVar19;
        if (uVar19 == 0) goto LAB_0020e5dd;
        iVar10 = context->width;
        iVar18 = uVar12 + context->align + -1;
        iVar18 = iVar18 - iVar18 % context->align;
        local_60 = uVar6;
        local_58 = uVar11;
        local_38 = psVar17;
        if ((iVar10 < iVar18) || (iVar1 = context->height, iVar1 < (int)uVar19)) {
          local_a0 = (stbrp_node **)0x0;
          local_a4 = 0;
          uVar12 = 0;
        }
        else {
          c = (stbrp_context *)*local_70;
          psVar14 = (stbrp_node *)(ulong)(uint)c->width;
          local_68 = psVar14;
          if (iVar10 < c->width + iVar18) {
            local_a8 = 0x40000000;
            uVar12 = 0x40000000;
            local_a0 = (stbrp_node **)0x0;
          }
          else {
            uVar12 = 0x40000000;
            local_a0 = (stbrp_node **)0x0;
            local_a8 = 0x40000000;
            ppsVar13 = local_70;
            psVar21 = c;
            do {
              uVar19 = stbrp__skyline_find_min_y(psVar21,psVar14,iVar18,(int)&local_8c,(int *)in_R8)
              ;
              if (local_88->heuristic == 0) {
                if ((int)uVar19 < (int)uVar12) {
                  local_a0 = ppsVar13;
                  uVar12 = uVar19;
                }
              }
              else if (((int)((int)local_80 + uVar19) <= iVar1) &&
                      (((int)uVar19 < (int)uVar12 || ((uVar19 == uVar12 && (local_8c < local_a8)))))
                      ) {
                local_a8 = local_8c;
                local_a0 = ppsVar13;
                uVar12 = uVar19;
              }
              ppsVar13 = (stbrp_node **)&psVar21->align;
              uVar19 = (*(stbrp_context **)&psVar21->align)->width;
              psVar14 = (stbrp_node *)(ulong)uVar19;
              psVar21 = *(stbrp_context **)&psVar21->align;
            } while ((int)(uVar19 + iVar18) <= iVar10);
          }
          if (local_a0 == (stbrp_node **)0x0) {
            local_a4 = 0;
          }
          else {
            local_a4 = (*local_a0)->x;
          }
          rects = local_40;
          context = local_88;
          uVar20 = local_50;
          uVar22 = local_48;
          if (local_88->heuristic == 1) {
            iVar10 = (int)local_68;
            psVar21 = c;
            while (ppsVar13 = local_70, iVar10 < iVar18) {
              psVar21 = *(stbrp_context **)&psVar21->align;
              iVar10 = psVar21->width;
            }
            do {
              uVar19 = psVar21->width - iVar18;
              ppsVar3 = ppsVar13;
              psVar4 = c;
              do {
                c = psVar4;
                ppsVar13 = ppsVar3;
                ppsVar3 = (stbrp_node **)&c->align;
                psVar4 = *(stbrp_context **)&c->align;
              } while ((*(stbrp_context **)&c->align)->width <= (int)uVar19);
              uVar5 = stbrp__skyline_find_min_y
                                (c,(stbrp_node *)(ulong)uVar19,iVar18,(int)&local_90,(int *)in_R8);
              if ((((int)((int)local_80 + uVar5) <= iVar1) && ((int)uVar5 <= (int)uVar12)) &&
                 ((((int)uVar5 < (int)uVar12 || (local_90 < local_a8)) ||
                  ((local_90 == local_a8 && ((int)uVar19 < (int)local_a4)))))) {
                local_a8 = local_90;
                local_a4 = uVar19;
                local_a0 = ppsVar13;
                uVar12 = uVar5;
              }
              psVar21 = *(stbrp_context **)&psVar21->align;
              rects = local_40;
              context = local_88;
              uVar20 = local_50;
              uVar22 = local_48;
            } while (psVar21 != (stbrp_context *)0x0);
          }
        }
        uVar11 = local_58;
        psVar17 = local_38;
        if (local_a0 == (stbrp_node **)0x0) {
LAB_0020e819:
          local_38->y = 0x7fffffff;
          __nmemb = 0x7fffffff;
          lVar8 = 0xc;
        }
        else {
          __nmemb = (size_t)uVar12;
          iVar10 = (int)local_80 + uVar12;
          if ((context->height < iVar10) ||
             (psVar14 = context->free_head, psVar14 == (stbrp_node *)0x0)) goto LAB_0020e819;
          psVar14->x = local_a4;
          psVar14->y = iVar10;
          context->free_head = psVar14->next;
          psVar16 = *local_a0;
          psVar15 = psVar16;
          if (psVar16->x < (int)local_a4) {
            psVar15 = psVar16->next;
            local_a0 = &psVar16->next;
          }
          *local_a0 = psVar14;
          if (psVar15->next != (stbrp_node *)0x0) {
            local_a0 = &psVar15->next;
            psVar16 = psVar15->next;
            do {
              if ((int)((int)local_60 + local_a4) < psVar16->x) break;
              *local_a0 = context->free_head;
              context->free_head = psVar15;
              local_a0 = &psVar16->next;
              ppsVar13 = &psVar16->next;
              psVar15 = psVar16;
              psVar16 = *ppsVar13;
            } while (*ppsVar13 != (stbrp_node *)0x0);
          }
          psVar14->next = psVar15;
          iVar10 = (int)local_60 + local_a4;
          if (psVar15->x < iVar10) {
            psVar15->x = iVar10;
          }
          local_38->x = local_a4;
          lVar8 = 0x10;
        }
      }
      num_rects = (int)uVar20;
      *(int *)((long)&psVar17->id + lVar8) = (int)__nmemb;
      uVar11 = uVar11 + 1;
      in_R8 = local_a0;
    } while (uVar11 != uVar22);
  }
  if (1 < (uint)num_rects) {
    qsort(rects,local_78,0x18,rect_original_order);
    __nmemb = extraout_RAX_00;
  }
  if (0 < num_rects) {
    __nmemb = uVar22 * 0x18;
    sVar9 = 0;
    do {
      bVar23 = true;
      if (*(int *)((long)&rects->x + sVar9) == 0x7fffffff) {
        bVar23 = *(int *)((long)&rects->y + sVar9) != 0x7fffffff;
      }
      *(uint *)((long)&rects->was_packed + sVar9) = (uint)bVar23;
      sVar9 = sVar9 + 0x18;
    } while (__nmemb != sVar9);
  }
  return (int)__nmemb;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}